

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

If_Grp_t * If_CluDecUsingCofs(If_Grp_t *__return_storage_ptr__,word *pTruth,int nVars,int nLutLeaf)

{
  uint p;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  ulong uVar10;
  int iVar11;
  uint iVar;
  word *pOut;
  int Pla2Var [18];
  int Var2Pla [18];
  int P2V [18];
  int V2P [18];
  word pF2 [1024];
  
  __return_storage_ptr__->nVars = '\0';
  __return_storage_ptr__->nMyu = '\0';
  __return_storage_ptr__->pVars[0] = '\0';
  __return_storage_ptr__->pVars[1] = '\0';
  __return_storage_ptr__->pVars[2] = '\0';
  __return_storage_ptr__->pVars[3] = '\0';
  __return_storage_ptr__->pVars[4] = '\0';
  __return_storage_ptr__->pVars[5] = '\0';
  __return_storage_ptr__->pVars[6] = '\0';
  __return_storage_ptr__->pVars[7] = '\0';
  __return_storage_ptr__->pVars[8] = '\0';
  __return_storage_ptr__->pVars[9] = '\0';
  __return_storage_ptr__->pVars[10] = '\0';
  __return_storage_ptr__->pVars[0xb] = '\0';
  __return_storage_ptr__->pVars[0xc] = '\0';
  __return_storage_ptr__->pVars[0xd] = '\0';
  __return_storage_ptr__->pVars[0xe] = '\0';
  __return_storage_ptr__->pVars[0xf] = '\0';
  pOut = pF2;
  If_CluCopy(pOut,pTruth,nVars);
  uVar8 = 0;
  uVar10 = 0;
  if (0 < nVars) {
    uVar10 = (ulong)(uint)nVars;
  }
  for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    Pla2Var[uVar8] = (int)uVar8;
    Var2Pla[uVar8] = (int)uVar8;
  }
  iVar11 = 0;
  iVar6 = nVars - nLutLeaf;
  if (nVars - nLutLeaf < 1) {
    iVar6 = iVar11;
  }
  do {
    if (iVar11 == iVar6) {
      cVar9 = (char)nLutLeaf;
      __return_storage_ptr__->nVars = cVar9;
      __return_storage_ptr__->nMyu = '\x02';
      uVar10 = 0;
      uVar8 = (ulong)(uint)(int)cVar9;
      if (cVar9 < '\x01') {
        uVar8 = uVar10;
      }
      for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        __return_storage_ptr__->pVars[uVar10] = (char)Pla2Var[uVar10];
      }
      return __return_storage_ptr__;
    }
    p = nVars - 1;
    iVar = p;
    while( true ) {
      if ((int)iVar < 0) goto LAB_0035aeeb;
      uVar7 = If_CluDetectSpecialCaseCofs(pOut,nVars,iVar);
      if (uVar7 != 0xffffffff) break;
      iVar = iVar - 1;
    }
    iVar1 = Pla2Var[iVar];
    while (iVar2 = Var2Pla[iVar1], iVar2 < (int)p) {
      iVar3 = Pla2Var[iVar2];
      Var2Pla[iVar3] = Var2Pla[iVar3] + 1;
      iVar4 = Pla2Var[(long)iVar2 + 1];
      Var2Pla[iVar4] = Var2Pla[iVar4] + -1;
      Pla2Var[(long)iVar2 + 1] = iVar3;
      Pla2Var[iVar2] = iVar4;
    }
    uVar8 = 0;
    if (0 < nVars) {
      uVar8 = (ulong)(uint)nVars;
    }
    for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      P2V[uVar10] = (int)uVar10;
      V2P[uVar10] = (int)uVar10;
    }
    If_CluMoveVar(pOut,nVars,V2P,P2V,iVar,p);
    if (uVar7 < 2) {
      if (nVars < 7) {
        uVar8 = Truth6[(int)p] & *pOut;
        uVar10 = uVar8 >> ((byte)(1 << ((byte)p & 0x1f)) & 0x3f);
LAB_0035aecb:
        *pOut = uVar10 | uVar8;
        nVars = p;
      }
      else {
        pOut = pOut + (1 << ((char)nVars - 6U & 0x1f)) / 2;
        nVars = p;
      }
    }
    else {
      bVar5 = nVars < 7;
      nVars = p;
      if (bVar5) {
        uVar8 = ~Truth6[(int)p] & *pOut;
        uVar10 = uVar8 << ((byte)(1 << ((byte)p & 0x1f)) & 0x3f);
        goto LAB_0035aecb;
      }
    }
LAB_0035aeeb:
    iVar11 = iVar11 + 1;
    if (iVar == 0xffffffff) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

If_Grp_t If_CluDecUsingCofs( word * pTruth, int nVars, int nLutLeaf )
{
    If_Grp_t G = {0};
    word pF2[CLU_WRD_MAX], * pF = pF2;
    int Var2Pla[CLU_VAR_MAX+2], Pla2Var[CLU_VAR_MAX+2];
    int V2P[CLU_VAR_MAX+2], P2V[CLU_VAR_MAX+2];
    int nVarsNeeded = nVars - nLutLeaf;
    int v, i, k, iVar, State;
//Kit_DsdPrintFromTruth( (unsigned*)pTruth, nVars ); printf( "\n" );
    // create local copy
    If_CluCopy( pF, pTruth, nVars );
    for ( k = 0; k < nVars; k++ )
        Var2Pla[k] = Pla2Var[k] = k;
    // find decomposable vars 
    for ( i = 0; i < nVarsNeeded; i++ )
    {
        for ( v = nVars - 1; v >= 0; v-- )
        {
            State = If_CluDetectSpecialCaseCofs( pF, nVars, v );
            if ( State == -1 )
                continue;
            // update the variable place
            iVar = Pla2Var[v];
            while ( Var2Pla[iVar] < nVars - 1 )
            {
                int iPlace0 = Var2Pla[iVar];
                int iPlace1 = Var2Pla[iVar]+1;
                Var2Pla[Pla2Var[iPlace0]]++;
                Var2Pla[Pla2Var[iPlace1]]--;
                Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
                Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
                Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
            }
            // move this variable to the top
            for ( k = 0; k < nVars; k++ )
                V2P[k] = P2V[k] = k;
//Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
            If_CluMoveVar( pF, nVars, V2P, P2V, v, nVars - 1 );
//Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
            // choose cofactor to follow
            iVar = nVars - 1;
            if ( State == 0 || State == 1 ) // need cof1
            {
                if ( iVar < 6 )
                    pF[0] = (pF[0] &  Truth6[iVar]) | ((pF[0] &  Truth6[iVar]) >> (1 << iVar));
                else
                    pF += If_CluWordNum( nVars ) / 2;
            }
            else // need cof0
            {
                if ( iVar < 6 )
                    pF[0] = (pF[0] & ~Truth6[iVar]) | ((pF[0] & ~Truth6[iVar]) << (1 << iVar));
            }
            // update the variable count
            nVars--;
            break;
        }
        if ( v == -1 )
            return G;
    }
    // create the resulting group
    G.nVars = nLutLeaf;
    G.nMyu = 2;
    for ( v = 0; v < G.nVars; v++ )
        G.pVars[v] = Pla2Var[v];
    return G;
}